

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

bool __thiscall
google::protobuf::EnumValueDescriptorProto::IsInitialized(EnumValueDescriptorProto *this)

{
  uint uVar1;
  bool bVar2;
  LogMessage *other;
  EnumValueOptions *pEVar3;
  LogMessage local_58;
  LogFinisher local_19;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  pEVar3 = this->options_;
  if ((pEVar3 == (EnumValueOptions *)0x0 & (byte)uVar1 >> 1) == 1) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/descriptor.pb.h"
               ,0x2687);
    other = internal::LogMessage::operator<<
                      (&local_58,"CHECK failed: !value || options_ != nullptr: ");
    internal::LogFinisher::operator=(&local_19,other);
    internal::LogMessage::~LogMessage(&local_58);
    pEVar3 = this->options_;
LAB_0029c913:
    bVar2 = internal::ExtensionSet::IsInitialized(&pEVar3->_extensions_);
    if (bVar2) {
      bVar2 = internal::AllAreInitialized<google::protobuf::UninterpretedOption>
                        (&pEVar3->uninterpreted_option_);
      if (bVar2) goto LAB_0029c930;
    }
    bVar2 = false;
  }
  else {
    if ((uVar1 & 2) != 0) goto LAB_0029c913;
LAB_0029c930:
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool EnumValueDescriptorProto::IsInitialized() const {
  if (_internal_has_options()) {
    if (!options_->IsInitialized()) return false;
  }
  return true;
}